

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

string * format<std::__cxx11::string,std::__cxx11::string>
                   (string *__return_storage_ptr__,string *fmt,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local;
  string *fmt_local;
  
  local_28 = args_1;
  args_local_1 = args;
  args_local = fmt;
  fmt_local = __return_storage_ptr__;
  std::__cxx11::string::string((string *)&local_48,(string *)args);
  std::__cxx11::string::string((string *)&local_68,(string *)args_1);
  format<std::__cxx11::string,std::__cxx11::string>
            (__return_storage_ptr__,1,fmt,&local_48,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

const std::string format (const std::string& fmt, Args... args)
{
    return format (1, fmt, args...);
}